

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOFileData.h
# Opt level: O1

void __thiscall Assimp::LWO::Layer::Layer(Layer *this,Layer *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  uint16_t uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  
  (this->mTempPoints).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (param_1->mTempPoints).
       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->mTempPoints).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (param_1->mTempPoints).
       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->mTempPoints).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->mTempPoints).
       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->mTempPoints).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->mTempPoints).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->mTempPoints).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mPointReferrers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->mPointReferrers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->mPointReferrers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->mPointReferrers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->mPointReferrers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->mPointReferrers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->mPointReferrers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->mPointReferrers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->mPointReferrers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mWeightChannels).
  super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (param_1->mWeightChannels).
       super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->mWeightChannels).
  super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (param_1->mWeightChannels).
       super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->mWeightChannels).
  super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->mWeightChannels).
       super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->mWeightChannels).
  super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->mWeightChannels).
  super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->mWeightChannels).
  super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mSWeightChannels).
  super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (param_1->mSWeightChannels).
       super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->mSWeightChannels).
  super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (param_1->mSWeightChannels).
       super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->mSWeightChannels).
  super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->mSWeightChannels).
       super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->mSWeightChannels).
  super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->mSWeightChannels).
  super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->mSWeightChannels).
  super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mVColorChannels).
  super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (param_1->mVColorChannels).
       super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->mVColorChannels).
  super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (param_1->mVColorChannels).
       super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->mVColorChannels).
  super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->mVColorChannels).
       super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->mVColorChannels).
  super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->mVColorChannels).
  super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->mVColorChannels).
  super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mUVChannels).
  super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->mUVChannels).
       super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->mUVChannels).
  super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->mUVChannels).
       super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->mUVChannels).
  super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->mUVChannels).
       super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->mUVChannels).
  super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->mUVChannels).
  super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->mUVChannels).
  super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mNormals).super_VMapEntry._vptr_VMapEntry = (_func_int **)&PTR__VMapEntry_0090abf8;
  (this->mNormals).super_VMapEntry.name._M_dataplus._M_p =
       (pointer)&(this->mNormals).super_VMapEntry.name.field_2;
  pcVar2 = (param_1->mNormals).super_VMapEntry.name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->mNormals).super_VMapEntry.name,pcVar2,
             pcVar2 + (param_1->mNormals).super_VMapEntry.name._M_string_length);
  (this->mNormals).super_VMapEntry.dims = (param_1->mNormals).super_VMapEntry.dims;
  std::vector<float,_std::allocator<float>_>::vector
            (&(this->mNormals).super_VMapEntry.rawData,&(param_1->mNormals).super_VMapEntry.rawData)
  ;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&(this->mNormals).super_VMapEntry.abAssigned,
             &(param_1->mNormals).super_VMapEntry.abAssigned);
  (this->mNormals).super_VMapEntry._vptr_VMapEntry = (_func_int **)&PTR__VMapEntry_0090aba8;
  (this->mFaces).super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->mFaces).super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->mFaces).super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->mFaces).super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->mFaces).super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->mFaces).super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->mFaces).super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->mFaces).super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->mFaces).super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar4 = param_1->mIndex;
  this->mParent = param_1->mParent;
  this->mIndex = uVar4;
  uVar5 = param_1->mPointIDXOfs;
  this->mFaceIDXOfs = param_1->mFaceIDXOfs;
  this->mPointIDXOfs = uVar5;
  paVar1 = &(this->mName).field_2;
  (this->mName)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->mName)._M_dataplus._M_p;
  paVar8 = &(param_1->mName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar8) {
    uVar3 = *(undefined8 *)((long)&(param_1->mName).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar8->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->mName).field_2 + 8) = uVar3;
  }
  else {
    (this->mName)._M_dataplus._M_p = pcVar2;
    (this->mName).field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  (this->mName)._M_string_length = (param_1->mName)._M_string_length;
  (param_1->mName)._M_dataplus._M_p = (pointer)paVar8;
  (param_1->mName)._M_string_length = 0;
  (param_1->mName).field_2._M_local_buf[0] = '\0';
  fVar6 = (param_1->mPivot).x;
  fVar7 = (param_1->mPivot).y;
  *(undefined8 *)((long)&(this->mPivot).y + 1) = *(undefined8 *)((long)&(param_1->mPivot).y + 1);
  (this->mPivot).x = fVar6;
  (this->mPivot).y = fVar7;
  return;
}

Assistant:

Layer()
        : mFaceIDXOfs   (0)
        , mPointIDXOfs  (0)
        , mParent       (0x0)
        , mIndex        (0xffff)
        , skip          (false)
    {}